

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# package_list.h
# Opt level: O1

void __thiscall PackageList::freeze(PackageList *this)

{
  ostream *poVar1;
  _Rb_tree_node_base *p_Var2;
  
  for (p_Var2 = (this->packages)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var2 != &(this->packages)._M_t._M_impl.super__Rb_tree_header;
      p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2)) {
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,*(char **)(p_Var2 + 2),(long)p_Var2[2]._M_parent);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"==",2);
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar1,*(char **)(p_Var2 + 3),(long)p_Var2[3]._M_parent);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
    std::ostream::put((char)poVar1);
    std::ostream::flush();
  }
  return;
}

Assistant:

void freeze(){
        for(auto&p:packages){
            std::cout << p.second.name << "==" << p.second.version << std::endl;
        }
	}